

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void power(Vm *vm)

{
  _Bool _Var1;
  Vm *vm_local;
  
  primary_expr(vm);
  _Var1 = match(vm,TOKEN_STAR_STAR);
  if (_Var1) {
    factor(vm);
    emit_no_arg(vm,OP_POW);
  }
  return;
}

Assistant:

static void power(Vm *vm) {
    primary_expr(vm);

    if (match(vm, TOKEN_STAR_STAR)) {
        factor(vm);
        emit_no_arg(vm, OP_POW);
    }
}